

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O0

IterateResult __thiscall deqp::TestSubcase::iterate(TestSubcase *this)

{
  int iVar1;
  SubcaseBase *pSVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  RenderContext *pRVar3;
  undefined4 extraout_var_02;
  MessageBuilder *pMVar4;
  bool bVar5;
  MessageBuilder local_1f8;
  char *local_78;
  char *name;
  int i;
  GLenum glError;
  Functions *gl;
  runtime_error *ex_1;
  runtime_error *ex_2;
  runtime_error *ex;
  long subError;
  undefined1 local_30 [8];
  SubcaseBasePtr subcase;
  TestLog *log;
  TestSubcase *this_local;
  
  deqp::(anonymous_namespace)::current_context = (this->super_TestCase).m_context;
  subcase.m_state =
       (SharedPtrStateBase *)
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  (*this->m_factoryFunc)();
  pSVar2 = de::SharedPtr<deqp::SubcaseBase>::operator->((SharedPtr<deqp::SubcaseBase> *)local_30);
  SubcaseBase::Documentation(pSVar2);
  pSVar2 = de::SharedPtr<deqp::SubcaseBase>::operator->((SharedPtr<deqp::SubcaseBase> *)local_30);
  glu::CallLogWrapper::enableLogging(&(pSVar2->super_GLWrapper).super_CallLogWrapper,true);
  ex = (runtime_error *)0x0;
  pSVar2 = de::SharedPtr<deqp::SubcaseBase>::operator->((SharedPtr<deqp::SubcaseBase> *)local_30);
  iVar1 = (*(pSVar2->super_GLWrapper)._vptr_GLWrapper[3])();
  ex = (runtime_error *)CONCAT44(extraout_var,iVar1);
  if (ex == (runtime_error *)&DAT_ffffffffffffffff) {
    tcu::TestLog::writeMessage((TestLog *)subcase.m_state,"Test Setup() failed");
  }
  if (ex == (runtime_error *)0x0) {
    pSVar2 = de::SharedPtr<deqp::SubcaseBase>::operator->((SharedPtr<deqp::SubcaseBase> *)local_30);
    iVar1 = (*(pSVar2->super_GLWrapper)._vptr_GLWrapper[2])();
    ex = (runtime_error *)CONCAT44(extraout_var_00,iVar1);
    if (ex == (runtime_error *)&DAT_ffffffffffffffff) {
      tcu::TestLog::writeMessage((TestLog *)subcase.m_state,"Test Run() failed");
    }
  }
  pSVar2 = de::SharedPtr<deqp::SubcaseBase>::operator->((SharedPtr<deqp::SubcaseBase> *)local_30);
  iVar1 = (*(pSVar2->super_GLWrapper)._vptr_GLWrapper[4])();
  if (CONCAT44(extraout_var_01,iVar1) == -1) {
    ex = (runtime_error *)&DAT_ffffffffffffffff;
    tcu::TestLog::writeMessage((TestLog *)subcase.m_state,"Test Cleanup() failed");
  }
  pSVar2 = de::SharedPtr<deqp::SubcaseBase>::operator->((SharedPtr<deqp::SubcaseBase> *)local_30);
  glu::CallLogWrapper::enableLogging(&(pSVar2->super_GLWrapper).super_CallLogWrapper,false);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _i = CONCAT44(extraout_var_02,iVar1);
  name._4_4_ = (**(code **)(_i + 0x800))();
  name._0_4_ = 0;
  while( true ) {
    bVar5 = false;
    if ((int)name < 100) {
      iVar1 = (**(code **)(_i + 0x800))();
      bVar5 = iVar1 != 0;
    }
    if (!bVar5) break;
    name._0_4_ = (int)name + 1;
  }
  if (name._4_4_ != 0) {
    local_78 = glu::getErrorName(name._4_4_);
    if (local_78 == (char *)0x0) {
      local_78 = "UNKNOWN ERROR";
    }
    tcu::TestLog::operator<<
              (&local_1f8,(TestLog *)subcase.m_state,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1f8,(char (*) [45])"After test execution glGetError() returned: ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_78);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [27])", forcing FAIL for subcase");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1f8);
    ex = (runtime_error *)&DAT_ffffffffffffffff;
  }
  if (ex == (runtime_error *)&DAT_ffffffffffffffff) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
    this_local._4_4_ = STOP;
  }
  else if (ex == (runtime_error *)0x10) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not supported");
    this_local._4_4_ = STOP;
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    iVar1 = this->m_iterationCount + -1;
    this->m_iterationCount = iVar1;
    if (iVar1 == 0) {
      this_local._4_4_ = STOP;
    }
    else {
      this_local._4_4_ = CONTINUE;
    }
  }
  de::SharedPtr<deqp::SubcaseBase>::~SharedPtr((SharedPtr<deqp::SubcaseBase> *)local_30);
  return this_local._4_4_;
}

Assistant:

TestSubcase::IterateResult TestSubcase::iterate(void)
{
	current_context = &m_context;
	using namespace std;
	using tcu::TestLog;
	TestLog& log = m_testCtx.getLog();

	SubcaseBase::SubcaseBasePtr subcase = m_factoryFunc();
	subcase->Documentation();
	subcase->enableLogging(true);
	//Run subcase
	long subError = NO_ERROR;
	// test case setup
	try
	{
		subError = subcase->Setup();
		if (subError == ERROR)
			log.writeMessage("Test Setup() failed");
	}
	catch (const runtime_error& ex)
	{
		log.writeMessage(ex.what());
		subError = ERROR;
	}
	catch (...)
	{
		log.writeMessage("Undefined exception.");
		subError = ERROR;
	}

	// test case run
	if (subError == NO_ERROR)
	{
		try
		{
			subError = subcase->Run();
			if (subError == ERROR)
				log.writeMessage("Test Run() failed");
		}
		catch (const runtime_error& ex)
		{
			log.writeMessage(ex.what());
			subError = ERROR;
		}
		catch (...)
		{
			log.writeMessage("Undefined exception.");
			subError = ERROR;
		}
	}

	// test case cleanup
	try
	{
		if (subcase->Cleanup() == ERROR)
		{
			subError = ERROR;
			log.writeMessage("Test Cleanup() failed");
		}
	}
	catch (const runtime_error& ex)
	{
		log.writeMessage(ex.what());
		subError = ERROR;
	}
	catch (...)
	{
		log.writeMessage("Undefined exception.");
		subError = ERROR;
	}
	subcase->enableLogging(false);

	//check gl error state
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();
	glw::GLenum			  glError = gl.getError();
	for (int i = 0; i < 100 && gl.getError(); ++i)
		;
	if (glError != GL_NO_ERROR)
	{
		const char* name = glu::getErrorName(glError);
		if (name == DE_NULL)
			name = "UNKNOWN ERROR";
		log << TestLog::Message << "After test execution glGetError() returned: " << name
			<< ", forcing FAIL for subcase" << TestLog::EndMessage;
		subError = ERROR;
	}

	if (subError == ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}
	else if (subError == NOT_SUPPORTED)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	if (--m_iterationCount)
		return CONTINUE;
	else
		return STOP;
}